

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipart_parser.h
# Opt level: O2

file * __thiscall cppcms::impl::multipart_parser::get_file(multipart_parser *this)

{
  logic_error *this_00;
  allocator local_39;
  string local_38;
  
  if (this->file_is_ready_ != false) {
    return (this->file_).super___shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&local_38,"Invalid state for get_file",&local_39);
  booster::logic_error::logic_error(this_00,&local_38);
  __cxa_throw(this_00,&booster::logic_error::typeinfo,booster::logic_error::~logic_error);
}

Assistant:

http::file &get_file()
			{
				if(!file_is_ready_)
					throw booster::logic_error("Invalid state for get_file");
				return *file_;
			}